

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_tree.c
# Opt level: O2

int addMerkleNodes(tree_t *tree,uint16_t *missingLeaves,size_t missingLeavesSize,uint8_t *input,
                  size_t inputSize)

{
  uint i_00;
  size_t sVar1;
  uint *__ptr;
  size_t i;
  size_t sVar2;
  int local_40;
  size_t revealedSize;
  
  revealedSize = 0;
  __ptr = getRevealedMerkleNodes(tree,missingLeaves,missingLeavesSize,&revealedSize);
  sVar1 = revealedSize;
  local_40 = -1;
  if ((__ptr != (uint *)0x0) && (tree->dataSize * revealedSize - inputSize == 0)) {
    local_40 = 0;
    for (sVar2 = 0; sVar1 != sVar2; sVar2 = sVar2 + 1) {
      i_00 = __ptr[sVar2];
      memcpy(tree->nodes + tree->dataSize * i_00,input,(ulong)tree->dataSize);
      input = input + tree->dataSize;
      markNode(tree,i_00);
    }
  }
  free(__ptr);
  return local_40;
}

Assistant:

int addMerkleNodes(tree_t* tree, uint16_t* missingLeaves, size_t missingLeavesSize, uint8_t* input,
                   size_t inputSize) {
  assert(missingLeavesSize < tree->numLeaves);

  int ret             = -1;
  size_t revealedSize = 0;
  unsigned int* revealed =
      getRevealedMerkleNodes(tree, missingLeaves, missingLeavesSize, &revealedSize);
  if (!revealed) {
    goto Exit;
  }
  assert(!contains(revealed, revealedSize, 0));

  if (inputSize != revealedSize * tree->dataSize) {
    goto Exit;
  }

  /* Deserialize input */
  for (size_t i = 0; i < revealedSize; i++) {
    memcpy(&tree->nodes[revealed[i] * tree->dataSize], input, tree->dataSize);
    input += tree->dataSize;
    markNode(tree, revealed[i]);
  }
  ret = 0;

Exit:
  free(revealed);

  return ret;
}